

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_create(REF_LIST *ref_list_ptr)

{
  REF_LIST pRVar1;
  REF_INT *pRVar2;
  REF_LIST ref_list;
  REF_LIST *ref_list_ptr_local;
  
  pRVar1 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar1;
  if (*ref_list_ptr == (REF_LIST)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x1e,
           "ref_list_create","malloc *ref_list_ptr of REF_LIST_STRUCT NULL");
    ref_list_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_list_ptr;
    pRVar1->n = 0;
    pRVar1->max = 10;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x25,
             "ref_list_create","malloc ref_list->value of REF_INT negative");
      ref_list_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
      pRVar1->value = pRVar2;
      if (pRVar1->value == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x25
               ,"ref_list_create","malloc ref_list->value of REF_INT NULL");
        ref_list_ptr_local._4_4_ = 2;
      }
      else {
        ref_list_ptr_local._4_4_ = 0;
      }
    }
  }
  return ref_list_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_list_create(REF_LIST *ref_list_ptr) {
  REF_LIST ref_list;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);

  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = 0;
  ref_list_max(ref_list) = 10;

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);

  return REF_SUCCESS;
}